

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_sent(Plug *plug,size_t bufsize)

{
  size_t bufsize_local;
  Plug *plug_local;
  
  return;
}

Assistant:

static void share_sent(Plug *plug, size_t bufsize)
{
    /* ssh_sharing_connstate *cs = container_of(
        plug, ssh_sharing_connstate, plug); */

    /*
     * We do nothing here, because we expect that there won't be a
     * need to throttle and unthrottle the connection to a downstream.
     * It should automatically throttle itself: if the SSH server
     * sends huge amounts of data on all channels then it'll run out
     * of window until our downstream sends it back some
     * WINDOW_ADJUSTs.
     */
}